

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O3

SubpassDesc * __thiscall
Diligent::RenderPassBase<Diligent::EngineGLImplTraits>::GetSubpass
          (RenderPassBase<Diligent::EngineGLImplTraits> *this,Uint32 SubpassIndex)

{
  char (*in_RCX) [41];
  string msg;
  string local_38;
  
  if ((this->
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      ).m_Desc.SubpassCount <= SubpassIndex) {
    FormatString<char[26],char[41]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SubpassIndex < this->m_Desc.SubpassCount",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderPassBase.hpp"
               ,0x94);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (this->
         super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
         ).m_Desc.pSubpasses + SubpassIndex;
}

Assistant:

const SubpassDesc& GetSubpass(Uint32 SubpassIndex) const
    {
        VERIFY_EXPR(SubpassIndex < this->m_Desc.SubpassCount);
        return this->m_Desc.pSubpasses[SubpassIndex];
    }